

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FieldDescriptorProto *descriptor;
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  Descriptor *this_00;
  EnumDescriptor *pEVar4;
  string_view sVar5;
  anon_class_8_1_a7e8901a local_88;
  VoidPtr local_80;
  Invoker<std::__cxx11::basic_string<char>_> local_78;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  FieldDescriptorProto *local_20;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    local_30 = Descriptor::full_name(this_00);
    sVar5._M_str = local_30._M_str;
    sVar5._M_len = (size_t)sVar5._M_str;
    bVar1 = anon_unknown_24::AllowedExtendeeInProto3((anon_unknown_24 *)local_30._M_len,sVar5);
    if (!bVar1) {
      local_40 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      AddError(this,local_40,&local_20->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  bVar1 = FieldDescriptor::is_required((FieldDescriptor *)proto_local);
  if (bVar1) {
    local_50 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    AddError(this,local_50,&local_20->super_Message,TYPE,
             "Required fields are not allowed in proto3.");
  }
  bVar1 = FieldDescriptor::has_default_value((FieldDescriptor *)proto_local);
  if (bVar1) {
    local_60 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    AddError(this,local_60,&local_20->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
  if ((CVar2 == CPPTYPE_ENUM) &&
     (pEVar4 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local),
     pEVar4 != (EnumDescriptor *)0x0)) {
    pEVar4 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
    bVar1 = EnumDescriptor::is_closed(pEVar4);
    if (bVar1) {
      local_70 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
      descriptor = local_20;
      local_88.field = (FieldDescriptor **)&proto_local;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::DescriptorBuilder::ValidateProto3Field(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_80,&local_88);
      make_error.invoker_ = local_78;
      make_error.ptr_.obj = local_80.obj;
      AddError(this,local_70,&descriptor->super_Message,TYPE,make_error);
    }
  }
  TVar3 = FieldDescriptor::type((FieldDescriptor *)proto_local);
  if (TVar3 == TYPE_GROUP) {
    sVar5 = FieldDescriptor::full_name((FieldDescriptor *)proto_local);
    AddError(this,sVar5,&local_20->super_Message,TYPE,"Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(const FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() && field->enum_type()->is_closed()) {
    // Proto3 messages can only use open enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE, [&] {
          return absl::StrCat("Enum type \"", field->enum_type()->full_name(),
                              "\" is not an open enum, but is used in \"",
                              field->containing_type()->full_name(),
                              "\" which is a proto3 message type.");
        });
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}